

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_lib_module.cc
# Opt level: O1

void __thiscall
tvm::runtime::SystemLibModuleNode::RegisterSymbol(SystemLibModuleNode *this,string *name,void *ptr)

{
  int iVar1;
  iterator iVar2;
  ostream *poVar3;
  mapped_type *ppvVar4;
  void **ctx_addr;
  LogMessageFatal local_1b0;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    *(SystemLibModuleNode **)ptr = this;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      if (this->module_blob_ != (void *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/system_lib_module.cc"
                   ,0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"Check failed: module_blob_ == nullptr",0x25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"Resetting mobule blob?",0x16);
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
      }
      this->module_blob_ = ptr;
    }
    else {
      iVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->tbl_)._M_h,name);
      if ((iVar2.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
           ._M_cur != (__node_type *)0x0) &&
         (*(void **)((long)iVar2.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
                           ._M_cur + 0x28) != ptr)) {
        dmlc::LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/system_lib_module.cc"
                   ,0x51);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0._0_8_,"SystemLib symbol ",0x11);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1b0._0_8_,(name->_M_dataplus)._M_p,
                            name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," get overriden to a different address ",0x26);
        poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"->",2);
        std::ostream::_M_insert<void_const*>(poVar3);
        dmlc::LogMessage::~LogMessage((LogMessage *)&local_1b0);
      }
      ppvVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->tbl_,name);
      *ppvVar4 = ptr;
    }
  }
  return;
}

Assistant:

void RegisterSymbol(const std::string &name, void *ptr) {
    /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
    //std::lock_guard<std::mutex> lock(mutex_);
    if (name == symbol::tvm_module_ctx) {
      void **ctx_addr = reinterpret_cast<void **>(ptr);
      *ctx_addr = this;
    } else if (name == symbol::tvm_dev_mblob) {
      // Record pointer to content of submodules to be loaded.
      // We defer loading submodules to the first call to GetFunction().
      // The reason is that RegisterSymbol() gets called when initializing the
      // syslib (i.e. library loading time), and the registeries aren't ready
      // yet. Therefore, we might not have the functionality to load submodules
      // now.
      CHECK(module_blob_ == nullptr) << "Resetting mobule blob?";
      module_blob_ = ptr;
    } else {
      auto it = tbl_.find(name);
      if (it != tbl_.end() && ptr != it->second) {
        LOG(WARNING) << "SystemLib symbol " << name
                     << " get overriden to a different address "
                     << ptr << "->" << it->second;
      }
      tbl_[name] = ptr;
    }
  }